

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O2

void __thiscall QDnsLookupRunnable::run(QDnsLookupRunnable *this)

{
  quint16 qVar1;
  QDnsServiceRecordPrivate *pQVar2;
  quint64 highest;
  quint32 qVar3;
  int iVar4;
  iterator __first;
  iterator __last;
  pointer pQVar5;
  iterator __first_00;
  iterator __last_00;
  QRandomGenerator *pQVar6;
  pointer pQVar7;
  QDebug *pQVar8;
  void *t;
  QDnsLookupRunnable *r;
  long lVar9;
  int j_1;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int j;
  int iVar13;
  long lVar14;
  long in_FS_OFFSET;
  QArrayDataPointer<QDnsServiceRecord> local_168;
  undefined8 local_150;
  QDebug local_148;
  QDebug local_140;
  QDebug local_138;
  undefined1 local_130 [12];
  undefined1 local_124;
  undefined1 local_120 [72];
  QList<QDnsMailExchangeRecord> local_d8 [3];
  QList<QDnsServiceRecord> local_90 [3];
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_130 + 8,0xaa,0xf0);
  local_130._8_4_ = 0;
  local_124 = 0;
  local_40 = 0;
  memset(local_120,0,0xd8);
  if ((this->requestName).d.size - 0x100U < 0xffffffffffffff01) {
    local_130._8_4_ = 3;
    QDnsLookup::tr((QString *)&local_168,"Invalid domain name",(char *)0x0,-1);
    local_168.d._0_4_ = (undefined4)local_120._0_8_;
    local_168.d._4_4_ = SUB84(local_120._0_8_,4);
    local_168.ptr._0_4_ = (undefined4)local_120._8_8_;
    local_168.ptr._4_4_ = SUB84(local_120._8_8_,4);
    local_168.size._0_4_ = (undefined4)local_120._16_8_;
    local_168.size._4_4_ = SUB84(local_120._16_8_,4);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
  }
  else {
    query(this,(QDnsLookupReply *)(local_130 + 8));
    if (1 < (ulong)local_d8[0].d.size) {
      __first = QList<QDnsMailExchangeRecord>::begin(local_d8);
      __last = QList<QDnsMailExchangeRecord>::end(local_d8);
      std::
      __sort<QList<QDnsMailExchangeRecord>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QDnsMailExchangeRecord_const&,QDnsMailExchangeRecord_const&)>>
                (__first,__last,
                 (_Iter_comp_iter<bool_(*)(const_QDnsMailExchangeRecord_&,_const_QDnsMailExchangeRecord_&)>
                  )0x20f563);
      lVar10 = 0;
      while( true ) {
        lVar10 = (long)(int)lVar10;
        if (local_d8[0].d.size <= lVar10) break;
        local_168.d._0_4_ = 0;
        local_168.d._4_4_ = 0;
        local_168.ptr._0_4_ = 0;
        local_168.ptr._4_4_ = 0;
        local_168.size._0_4_ = 0;
        local_168.size._4_4_ = 0;
        qVar1 = (local_d8[0].d.ptr[lVar10].d.d.ptr)->preference;
        lVar9 = lVar10 * 8;
        lVar14 = lVar10;
        while ((lVar14 < local_d8[0].d.size &&
               (*(quint16 *)(*(long *)((long)&((local_d8[0].d.ptr)->d).d.ptr + lVar9) + 0x40) ==
                qVar1))) {
          QList<QDnsMailExchangeRecord>::emplaceBack<QDnsMailExchangeRecord_const&>
                    ((QList<QDnsMailExchangeRecord> *)&local_168,
                     (QDnsMailExchangeRecord *)((long)&((local_d8[0].d.ptr)->d).d.ptr + lVar9));
          lVar14 = lVar14 + 1;
          lVar9 = lVar9 + 8;
        }
        while (highest = CONCAT44(local_168.size._4_4_,(undefined4)local_168.size), highest != 0) {
          pQVar6 = (QRandomGenerator *)QRandomGenerator64::global();
          QRandomGenerator::bounded(pQVar6,highest);
          QList<QDnsMailExchangeRecord>::takeAt
                    ((QList<QDnsMailExchangeRecord> *)local_130,(qsizetype)&local_168);
          pQVar5 = QList<QDnsMailExchangeRecord>::data(local_d8);
          pQVar2 = (QDnsServiceRecordPrivate *)pQVar5[lVar10].d.d.ptr;
          pQVar5[lVar10].d.d.ptr = (QDnsMailExchangeRecordPrivate *)local_130._0_8_;
          local_130._0_8_ = pQVar2;
          QDnsMailExchangeRecord::~QDnsMailExchangeRecord((QDnsMailExchangeRecord *)local_130);
          lVar10 = lVar10 + 1;
        }
        QArrayDataPointer<QDnsMailExchangeRecord>::~QArrayDataPointer
                  ((QArrayDataPointer<QDnsMailExchangeRecord> *)&local_168);
      }
    }
    if (1 < (ulong)local_90[0].d.size) {
      __first_00 = QList<QDnsServiceRecord>::begin(local_90);
      __last_00 = QList<QDnsServiceRecord>::end(local_90);
      std::
      __sort<QList<QDnsServiceRecord>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QDnsServiceRecord_const&,QDnsServiceRecord_const&)>>
                (__first_00,__last_00,
                 (_Iter_comp_iter<bool_(*)(const_QDnsServiceRecord_&,_const_QDnsServiceRecord_&)>)
                 0x20f579);
      iVar4 = 0;
      while( true ) {
        lVar10 = (long)iVar4;
        if (local_90[0].d.size <= lVar10) break;
        local_168.d._0_4_ = 0;
        local_168.d._4_4_ = 0;
        local_168.ptr._0_4_ = 0;
        local_168.ptr._4_4_ = 0;
        local_168.size._0_4_ = 0;
        local_168.size._4_4_ = 0;
        qVar1 = (local_90[0].d.ptr[lVar10].d.d.ptr)->priority;
        lVar9 = lVar10 * 8;
        iVar13 = 0;
        for (; lVar10 < local_90[0].d.size; lVar10 = lVar10 + 1) {
          lVar14 = *(long *)((long)&((local_90[0].d.ptr)->d).d.ptr + lVar9);
          if (*(quint16 *)(lVar14 + 0x42) != qVar1) break;
          iVar13 = iVar13 + (uint)*(ushort *)(lVar14 + 0x44);
          QList<QDnsServiceRecord>::emplaceBack<QDnsServiceRecord_const&>
                    ((QList<QDnsServiceRecord> *)&local_168,
                     (QDnsServiceRecord *)((long)&((local_90[0].d.ptr)->d).d.ptr + lVar9));
          lVar9 = lVar9 + 8;
        }
LAB_0020e904:
        while (CONCAT44(local_168.size._4_4_,(undefined4)local_168.size) != 0) {
          pQVar6 = (QRandomGenerator *)QRandomGenerator64::global();
          qVar3 = QRandomGenerator::bounded(pQVar6,iVar13 + 1);
          uVar11 = 0;
          lVar10 = -1;
          while (lVar10 - CONCAT44(local_168.size._4_4_,(undefined4)local_168.size) != -1) {
            uVar12 = (uint)*(ushort *)
                            (*(long *)(CONCAT44(local_168.ptr._4_4_,local_168.ptr._0_4_) + 8 +
                                      lVar10 * 8) + 0x44);
            uVar11 = uVar11 + uVar12;
            lVar10 = lVar10 + 1;
            if (qVar3 <= uVar11) {
              iVar13 = iVar13 - uVar12;
              QList<QDnsServiceRecord>::takeAt
                        ((QList<QDnsServiceRecord> *)local_130,(qsizetype)&local_168);
              pQVar7 = QList<QDnsServiceRecord>::data(local_90);
              pQVar2 = pQVar7[iVar4].d.d.ptr;
              pQVar7[iVar4].d.d.ptr = (QDnsServiceRecordPrivate *)local_130._0_8_;
              local_130._0_8_ = pQVar2;
              QDnsServiceRecord::~QDnsServiceRecord((QDnsServiceRecord *)local_130);
              iVar4 = iVar4 + 1;
              goto LAB_0020e904;
            }
          }
        }
        QArrayDataPointer<QDnsServiceRecord>::~QArrayDataPointer(&local_168);
      }
    }
  }
  finished(this,(QDnsLookupReply *)(local_130 + 8));
  if ((uint)local_130._8_4_ < 5) {
    if ((0x1aU >> (local_130._8_4_ & 0x1f) & 1) != 0) {
      if (lcDnsLookup()::category == '\0') {
        iVar4 = __cxa_guard_acquire(&lcDnsLookup()::category);
        if (iVar4 != 0) {
          QLoggingCategory::QLoggingCategory
                    ((QLoggingCategory *)lcDnsLookup()::category,"qt.network.dnslookup",
                     QtCriticalMsg);
          __cxa_atexit(QLoggingCategory::~QLoggingCategory,lcDnsLookup()::category,&__dso_handle);
          __cxa_guard_release(&lcDnsLookup()::category);
        }
      }
      if ((lcDnsLookup()::category[0x11] & 1) != 0) {
        local_168.d._0_4_ = 2;
        local_168.d._4_4_ = 0;
        local_168.ptr._0_4_ = 0;
        local_168.ptr._4_4_ = 0;
        local_168.size._0_4_ = 0;
        local_168.size._4_4_ = 0;
        local_150 = lcDnsLookup()::category._8_8_;
        QMessageLogger::warning();
        local_148.stream[0x30] = (Stream)0x0;
        pQVar8 = QDebug::operator<<(&local_148,"DNS lookup failed (");
        local_140.stream = pQVar8->stream;
        *(int *)(local_140.stream + 0x28) = *(int *)(local_140.stream + 0x28) + 1;
        ::operator<<((Stream *)local_130,(Error)&local_140);
        pQVar8 = QDebug::operator<<((QDebug *)local_130,"): ");
        t = (void *)QString::utf16();
        pQVar8 = QDebug::operator<<(pQVar8,t);
        r = (QDnsLookupRunnable *)QDebug::operator<<(pQVar8,"; request was ");
        ::operator<<(&local_138,r);
        QDebug::~QDebug(&local_138);
        QDebug::~QDebug((QDebug *)local_130);
        QDebug::~QDebug(&local_140);
        QDebug::~QDebug(&local_148);
      }
    }
  }
  QDnsLookupReply::~QDnsLookupReply((QDnsLookupReply *)(local_130 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDnsLookupRunnable::run()
{
    QDnsLookupReply reply;

    // Validate input.
    if (qsizetype n = requestName.size(); n > MaxDomainNameLength || n == 0) {
        reply.error = QDnsLookup::InvalidRequestError;
        reply.errorString = QDnsLookup::tr("Invalid domain name");
    } else {
        // Perform request.
        query(&reply);

        // Sort results.
        qt_qdnsmailexchangerecord_sort(reply.mailExchangeRecords);
        qt_qdnsservicerecord_sort(reply.serviceRecords);
    }

    emit finished(reply);

    // maybe print the lookup error as warning
    switch (reply.error) {
    case QDnsLookup::NoError:
    case QDnsLookup::OperationCancelledError:
    case QDnsLookup::NotFoundError:
    case QDnsLookup::ServerFailureError:
    case QDnsLookup::ServerRefusedError:
    case QDnsLookup::TimeoutError:
        break;      // no warning for these

    case QDnsLookup::ResolverError:
    case QDnsLookup::InvalidRequestError:
    case QDnsLookup::InvalidReplyError:
        qCWarning(lcDnsLookup()).nospace()
                << "DNS lookup failed (" << reply.error << "): "
              << qUtf16Printable(reply.errorString)
              << "; request was " << this;  // continues below
    }
}